

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_grail_sort_dyn_buffer(int64_t *arr,size_t Len)

{
  uint uVar1;
  uint LExtBuf;
  int64_t *extbuf;
  
  uVar1 = 1;
  do {
    LExtBuf = uVar1;
    uVar1 = LExtBuf * 2;
  } while (LExtBuf * LExtBuf < Len);
  extbuf = sorter_sort_new_buffer((ulong)LExtBuf);
  if (extbuf != (int64_t *)0x0) {
    sorter_grail_common_sort(arr,(int)Len,extbuf,LExtBuf);
    free(extbuf);
    return;
  }
  sorter_grail_sort_fixed_buffer(arr,Len);
  return;
}

Assistant:

void GRAIL_SORT_DYN_BUFFER(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;

  while (L * L < Len) {
    L *= 2;
  }

  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    GRAIL_SORT_FIXED_BUFFER(arr, Len);
  } else {
    GRAIL_COMMON_SORT(arr, (int)Len, ExtBuf, L);
    SORT_DELETE_BUFFER(ExtBuf);
  }
}